

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetTemporaryName(ExpressionContext *ctx,uint index,char *suffix)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  char *pcVar3;
  uint local_6c;
  char *local_68;
  char *pos;
  char *name;
  uint nameLength;
  uint suffixLength;
  char *curr;
  char buf [16];
  char *suffix_local;
  uint index_local;
  ExpressionContext *ctx_local;
  char *__s;
  
  curr._0_1_ = (char)((ulong)index % 10) + '0';
  _nameLength = &curr;
  suffix_local._4_4_ = index;
  while( true ) {
    _nameLength = (char **)((long)_nameLength + 1);
    suffix_local._4_4_ = suffix_local._4_4_ / 10;
    if (suffix_local._4_4_ == 0) break;
    *(char *)_nameLength = (char)((ulong)suffix_local._4_4_ % 10) + '0';
  }
  if (suffix == (char *)0x0) {
    local_6c = 0;
  }
  else {
    sVar2 = strlen(suffix);
    local_6c = (uint)sVar2;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(local_6c + 0x10));
  __s = (char *)CONCAT44(extraout_var,iVar1);
  builtin_strncpy(__s,"$temp",5);
  pcVar3 = __s + 5;
  do {
    local_68 = pcVar3;
    _nameLength = (char **)((long)_nameLength + -1);
    pcVar3 = local_68 + 1;
    *local_68 = *(char *)_nameLength;
  } while (_nameLength != &curr);
  if (suffix != (char *)0x0) {
    *pcVar3 = '_';
    memcpy(local_68 + 2,suffix,(ulong)local_6c);
    pcVar3 = local_68 + 2 + local_6c;
  }
  local_68 = pcVar3;
  *local_68 = '\0';
  sVar2 = strlen(__s);
  if (sVar2 < local_6c + 0x10) {
    InplaceStr::InplaceStr((InplaceStr *)&ctx_local,__s,local_68);
    return _ctx_local;
  }
  __assert_fail("strlen(name) < nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x2ba,
                "InplaceStr GetTemporaryName(ExpressionContext &, unsigned int, const char *)");
}

Assistant:

InplaceStr GetTemporaryName(ExpressionContext &ctx, unsigned index, const char *suffix)
{
	char buf[16];

	char *curr = buf;

	*curr++ = (char)((index % 10) + '0');

	while(index /= 10)
		*curr++ = (char)((index % 10) + '0');

	unsigned suffixLength = suffix ? (unsigned)strlen(suffix) : 0;

	unsigned nameLength = 16 + suffixLength;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, "$temp", 5);
	pos += 5;

	do
	{
		--curr;
		*pos++ = *curr;
	}
	while(curr != buf);

	if(suffix)
	{
		*pos++ = '_';

		memcpy(pos, suffix, suffixLength);
		pos += suffixLength;
	}

	*pos = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name, pos);
}